

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracing.cpp
# Opt level: O1

Vec3 compute_background_color(Ray *ray)

{
  Vec3 VVar1;
  Vec3 _unit_dir;
  Vec3 local_38;
  Vec3 local_2c;
  
  local_38.e[0] = 0.0;
  local_38.e[1] = 0.0;
  local_38.e[2] = 0.0;
  unit_vector(&local_2c);
  VVar1 = lerp<Vec3>(&ray->m_origin,&local_38,(local_2c.e[1] + 1.0) * 0.5);
  return (Vec3)VVar1.e;
}

Assistant:

Vec3
compute_background_color(const Ray& ray)
{
    // Background color
    const Vec3  _a(0.0f,0.0f,0.0f);
    const Vec3  _b(0.15f,0.15f,0.15f);

    const Vec3  _unit_dir = unit_vector(ray.GetDirection());  
    const float _t = 0.5f * (_unit_dir.y() + 1.0f); // [-1,1] -> [0,1]

    return lerp(_a, _b, _t);
}